

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::gotSignal(UnixEventPort *this,siginfo_t *siginfo)

{
  PromiseFulfiller<siginfo_t> *pPVar1;
  ChildSet *this_00;
  anon_struct_128_5_975a5653_for_value local_a8;
  SignalPromiseAdapter *local_28;
  SignalPromiseAdapter *ptr;
  Own<kj::UnixEventPort::ChildSet> *cs;
  siginfo_t *siginfo_local;
  UnixEventPort *this_local;
  
  cs = (Own<kj::UnixEventPort::ChildSet> *)siginfo;
  siginfo_local = (siginfo_t *)this;
  ptr = (SignalPromiseAdapter *)kj::_::readMaybe<kj::UnixEventPort::ChildSet>(&this->childSet);
  if ((ptr == (SignalPromiseAdapter *)0x0) || (*(int *)&cs->disposer != 0x11)) {
    local_28 = this->signalHead;
    while (local_28 != (SignalPromiseAdapter *)0x0) {
      if (local_28->signum == *(int *)&cs->disposer) {
        pPVar1 = local_28->fulfiller;
        cp<siginfo_t>(&local_a8,(anon_struct_128_5_975a5653_for_value *)cs);
        (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_a8);
        local_28 = SignalPromiseAdapter::removeFromList(local_28);
      }
      else {
        local_28 = local_28->next;
      }
    }
  }
  else {
    this_00 = Own<kj::UnixEventPort::ChildSet>::get((Own<kj::UnixEventPort::ChildSet> *)ptr);
    ChildSet::checkExits(this_00);
  }
  return;
}

Assistant:

void UnixEventPort::gotSignal(const siginfo_t& siginfo) {
  // If onChildExit() has been called and this is SIGCHLD, check for child exits.
  KJ_IF_MAYBE(cs, childSet) {
    if (siginfo.si_signo == SIGCHLD) {
      cs->get()->checkExits();
      return;
    }
  }

  // Fire any events waiting on this signal.
  auto ptr = signalHead;
  while (ptr != nullptr) {
    if (ptr->signum == siginfo.si_signo) {
      ptr->fulfiller.fulfill(kj::cp(siginfo));
      ptr = ptr->removeFromList();
    } else {
      ptr = ptr->next;
    }
  }
}